

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

Result __thiscall wabt::interp::Table::Grow(Table *this,Store *store,u32 count,Ref ref)

{
  Limits *pLVar1;
  pointer pRVar2;
  pointer pRVar3;
  ulong uVar4;
  u32 offset;
  bool bVar5;
  Enum EVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar8 = (ulong)count;
  pRVar2 = (this->elements_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pRVar3 = (this->elements_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar5 = Store::HasValueType(store,ref,*(ValueType *)&(this->type_).super_ExternType.field_0xc);
  if (bVar5) {
    uVar4 = (this->type_).limits.max;
    EVar6 = Error;
    if ((uVar8 <= uVar4) &&
       (uVar7 = (ulong)((long)pRVar2 - (long)pRVar3) >> 3, (uVar7 & 0xffffffff) <= uVar4 - uVar8)) {
      offset = (u32)uVar7;
      pLVar1 = &(this->type_).limits;
      pLVar1->initial = pLVar1->initial + uVar8;
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::resize
                (&this->elements_,(ulong)(offset + count));
      Fill(this,store,offset,ref,count);
      EVar6 = Ok;
    }
    return (Result)EVar6;
  }
  __assert_fail("store.HasValueType(ref, type_.element)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp.cc"
                ,0x209,"Result wabt::interp::Table::Grow(Store &, u32, Ref)");
}

Assistant:

Result Table::Grow(Store& store, u32 count, Ref ref) {
  size_t old_size = elements_.size();
  u32 new_size;
  assert(store.HasValueType(ref, type_.element));
  if (CanGrow<u32>(type_.limits, old_size, count, &new_size)) {
    // Grow the limits of the table too, so that if it is used as an
    // import to another module its new size is honored.
    type_.limits.initial += count;
    elements_.resize(new_size);
    Fill(store, old_size, ref, new_size - old_size);
    return Result::Ok;
  }
  return Result::Error;
}